

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O2

bool __thiscall DIS::SeesPdu::operator==(SeesPdu *this,SeesPdu *rhs)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  pointer pPVar5;
  pointer pVVar6;
  bool bVar7;
  bool bVar8;
  undefined4 in_ECX;
  undefined4 uVar9;
  size_t idx;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  bVar7 = DistributedEmissionsFamilyPdu::operator==
                    (&this->super_DistributedEmissionsFamilyPdu,
                     &rhs->super_DistributedEmissionsFamilyPdu);
  bVar8 = EntityID::operator==(&this->_orginatingEntityID,&rhs->_orginatingEntityID);
  uVar10._0_2_ = this->_infraredSignatureRepresentationIndex;
  uVar10._2_2_ = this->_acousticSignatureRepresentationIndex;
  uVar10._4_2_ = this->_radarCrossSectionSignatureRepresentationIndex;
  uVar10._6_2_ = this->_numberOfPropulsionSystems;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar10;
  uVar1 = rhs->_infraredSignatureRepresentationIndex;
  uVar2 = rhs->_acousticSignatureRepresentationIndex;
  uVar3 = rhs->_radarCrossSectionSignatureRepresentationIndex;
  uVar4 = rhs->_numberOfPropulsionSystems;
  auVar14._0_2_ = -(ushort)(uVar1 == (undefined2)uVar10);
  auVar14._2_2_ = -(ushort)(uVar2 == uVar10._2_2_);
  auVar14._4_2_ = -(ushort)(uVar3 == uVar10._4_2_);
  auVar14._6_2_ = -(ushort)(uVar4 == uVar10._6_2_);
  auVar14._8_2_ = 0xffff;
  auVar14._10_2_ = 0xffff;
  auVar14._12_2_ = 0xffff;
  auVar14._14_2_ = 0xffff;
  auVar12 = pshuflw(auVar12,auVar14,0x50);
  auVar13._0_4_ = auVar12._0_4_;
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar12._4_4_;
  auVar13._12_4_ = auVar12._4_4_;
  uVar9 = movmskpd(in_ECX,auVar13);
  bVar7 = (bool)(this->_radarCrossSectionSignatureRepresentationIndex ==
                 rhs->_radarCrossSectionSignatureRepresentationIndex & (byte)uVar9 >> 1 &
                (bVar8 && bVar7) & (byte)uVar9);
  lVar11 = 0;
  for (uVar10 = 0;
      pPVar5 = (this->_propulsionSystemData).
               super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->_propulsionSystemData).
                             super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 4);
      uVar10 = uVar10 + 1) {
    bVar8 = PropulsionSystemData::operator==
                      ((PropulsionSystemData *)((long)&pPVar5->_vptr_PropulsionSystemData + lVar11),
                       (PropulsionSystemData *)
                       ((long)&((rhs->_propulsionSystemData).
                                super__Vector_base<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_PropulsionSystemData + lVar11));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar11 = lVar11 + 0x10;
  }
  lVar11 = 0;
  for (uVar10 = 0;
      pVVar6 = (this->_vectoringSystemData).
               super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->_vectoringSystemData).
                             super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 4);
      uVar10 = uVar10 + 1) {
    bVar8 = VectoringNozzleSystemData::operator==
                      ((VectoringNozzleSystemData *)
                       ((long)&pVVar6->_vptr_VectoringNozzleSystemData + lVar11),
                       (VectoringNozzleSystemData *)
                       ((long)&((rhs->_vectoringSystemData).
                                super__Vector_base<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               _vptr_VectoringNozzleSystemData + lVar11));
    bVar7 = (bool)(bVar7 & bVar8);
    lVar11 = lVar11 + 0x10;
  }
  return bVar7;
}

Assistant:

bool SeesPdu::operator ==(const SeesPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_orginatingEntityID == rhs._orginatingEntityID) ) ivarsEqual = false;
     if( ! (_infraredSignatureRepresentationIndex == rhs._infraredSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_acousticSignatureRepresentationIndex == rhs._acousticSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_radarCrossSectionSignatureRepresentationIndex == rhs._radarCrossSectionSignatureRepresentationIndex) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _propulsionSystemData.size(); idx++)
     {
        if( ! ( _propulsionSystemData[idx] == rhs._propulsionSystemData[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _vectoringSystemData.size(); idx++)
     {
        if( ! ( _vectoringSystemData[idx] == rhs._vectoringSystemData[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }